

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLin>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLinLin *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  ImVec2 IVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  long lVar7;
  ImPlotContext *pIVar8;
  int iVar9;
  ImPlotContext *gp;
  ImPlotContext *pIVar10;
  int iVar11;
  float fVar12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot->CurrentPlot;
  if (((pIVar6->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar9 = getter->Count;
    local_48 = iVar9 + -1;
    lVar7 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    iVar9 = transformer->YAxis;
    uVar2 = *(ulong *)((long)getter->Ys + lVar7);
    uVar3 = *(ulong *)((long)getter->Xs + lVar7);
    IVar4 = GImPlot->PixelRange[iVar9].Min;
    local_3c.x = (float)(GImPlot->Mx *
                         ((((double)(uVar3 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                          (double)(uVar3 & 0xffffffff | 0x4330000000000000)) -
                         (pIVar6->XAxis).Range.Min) + (double)IVar4.x);
    local_3c.y = (float)(GImPlot->My[iVar9] *
                         ((((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                          (double)(uVar2 & 0xffffffff | 0x4330000000000000)) -
                         pIVar6->YAxis[iVar9].Range.Min) + (double)IVar4.y);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLin>
                *)local_58,DrawList,&pIVar6->PlotRect);
  }
  else {
    iVar9 = getter->Count;
    lVar7 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    iVar11 = transformer->YAxis;
    uVar2 = *(ulong *)((long)getter->Xs + lVar7);
    uVar3 = *(ulong *)((long)getter->Ys + lVar7);
    IVar4 = GImPlot->PixelRange[iVar11].Min;
    local_58._4_4_ =
         (undefined4)
         (GImPlot->My[iVar11] *
          ((((double)(uVar3 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(uVar3 & 0xffffffff | 0x4330000000000000)) - pIVar6->YAxis[iVar11].Range.Min) +
         (double)IVar4.y);
    local_58._0_4_ =
         (undefined4)
         (GImPlot->Mx *
          ((((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(uVar2 & 0xffffffff | 0x4330000000000000)) - (pIVar6->XAxis).Range.Min) +
         (double)IVar4.x);
    if (1 < iVar9) {
      iVar11 = 1;
      local_60 = GImPlot;
      pIVar8 = GImPlot;
      pIVar10 = GImPlot;
      do {
        lVar7 = (long)(((getter->Offset + iVar11) % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
        iVar5 = transformer->YAxis;
        uVar2 = *(ulong *)((long)getter->Ys + lVar7);
        uVar3 = *(ulong *)((long)getter->Xs + lVar7);
        IVar4 = pIVar8->PixelRange[iVar5].Min;
        local_68.x = (float)(pIVar8->Mx *
                             ((((double)(uVar3 >> 0x20 | 0x4530000000000000) -
                               1.9342813118337666e+25) +
                              (double)(uVar3 & 0xffffffff | 0x4330000000000000)) -
                             (pIVar8->CurrentPlot->XAxis).Range.Min) + (double)IVar4.x);
        local_68.y = (float)(pIVar8->My[iVar5] *
                             ((((double)(uVar2 >> 0x20 | 0x4530000000000000) -
                               1.9342813118337666e+25) +
                              (double)(uVar2 & 0xffffffff | 0x4330000000000000)) -
                             pIVar8->CurrentPlot->YAxis[iVar5].Range.Min) + (double)IVar4.y);
        pIVar6 = pIVar10->CurrentPlot;
        fVar12 = (float)local_58._4_4_;
        if (local_68.y <= (float)local_58._4_4_) {
          fVar12 = local_68.y;
        }
        if ((fVar12 < (pIVar6->PlotRect).Max.y) &&
           (fVar12 = (float)(~-(uint)(local_68.y <= (float)local_58._4_4_) & (uint)local_68.y |
                            -(uint)(local_68.y <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar12 && fVar12 != *pfVar1)) {
          fVar12 = (float)local_58._0_4_;
          if (local_68.x <= (float)local_58._0_4_) {
            fVar12 = local_68.x;
          }
          if ((fVar12 < (pIVar6->PlotRect).Max.x) &&
             (fVar12 = (float)(-(uint)(local_68.x <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(local_68.x <= (float)local_58._0_4_) & (uint)local_68.x),
             (pIVar6->PlotRect).Min.x <= fVar12 && fVar12 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_68,col,line_weight);
            iVar9 = getter->Count;
            pIVar8 = GImPlot;
            pIVar10 = local_60;
          }
        }
        iVar11 = iVar11 + 1;
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
      } while (iVar11 < iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}